

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O2

void __thiscall QKeySequenceEditPrivate::resetState(QKeySequenceEditPrivate *this)

{
  QLineEdit *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->releaseTimer).m_id != Invalid) {
    QBasicTimer::stop();
  }
  this->prevKey = -1;
  pQVar1 = this->lineEdit;
  QKeySequence::toString((SequenceFormat)&QStack_38);
  QLineEdit::setText(pQVar1,(QString *)&QStack_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  pQVar1 = this->lineEdit;
  QKeySequenceEdit::tr((QString *)&QStack_38,"Press shortcut",(char *)0x0,-1);
  QLineEdit::setPlaceholderText(pQVar1,(QString *)&QStack_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QKeySequenceEditPrivate::resetState()
{
    if (releaseTimer.isActive())
        releaseTimer.stop();
    prevKey = -1;
    lineEdit->setText(keySequence.toString(QKeySequence::NativeText));
    lineEdit->setPlaceholderText(QKeySequenceEdit::tr("Press shortcut"));
}